

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void dump_reg_vec(bit_vec v)

{
  long lVar1;
  int j;
  uint uVar2;
  int iVar3;
  
  if (v != (bit_vec)0x0) {
    iVar3 = 100;
    for (lVar1 = 0; lVar1 < v->len; lVar1 = lVar1 + 1) {
      for (uVar2 = 0; uVar2 != 7; uVar2 = uVar2 + 1) {
        if (((uint)(int)v->vec[lVar1] >> (uVar2 & 0x1f) & 1) != 0) {
          printf(" R%d",(ulong)(iVar3 + uVar2));
        }
      }
      iVar3 = iVar3 + 8;
    }
  }
  return;
}

Assistant:

static void
dump_reg_vec(bit_vec v)
{
    int i;
    if (v == NULL)
        return;
    for (i = 0; i < v->len; i++) {
        int j;
        for (j = 0; j < 7; j++) {
            if ((v->vec[i] & (1 << j)) != 0) {
                printf(" R%d", i * 8 + j + 100);
            }
        }
    }
}